

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_group_scrolled_end(nk_context *ctx)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  nk_vec2 nVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  nk_window *pnVar9;
  nk_panel *pnVar10;
  nk_panel *pnVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  nk_rect nVar22;
  nk_window pan;
  nk_window local_208;
  
  if ((ctx != (nk_context *)0x0) && (pnVar9 = ctx->current, pnVar9 != (nk_window *)0x0)) {
    pnVar10 = pnVar9->layout;
    pnVar11 = pnVar10->parent;
    memset(&local_208,0,0x1d0);
    nVar5 = (ctx->style).window.group_padding;
    fVar21 = (pnVar10->menu).h;
    uVar2 = (pnVar10->bounds).x;
    uVar6 = (pnVar10->bounds).y;
    fVar18 = nVar5.x;
    fVar19 = nVar5.y;
    local_208.bounds.x = (float)uVar2 - fVar18;
    local_208.bounds.y = (float)uVar6 - (pnVar10->header_height + fVar21);
    auVar15 = CONCAT88(0,CONCAT44(local_208.bounds.y,local_208.bounds.x));
    fVar17 = fVar18 + fVar18 + (pnVar10->bounds).w;
    local_208.bounds.w = fVar17;
    fVar21 = pnVar10->header_height + (pnVar10->bounds).h + fVar21;
    local_208.bounds.h = fVar21;
    local_208.flags = pnVar10->flags;
    fVar20 = 0.0;
    if ((local_208.flags & 1) != 0) {
      fVar1 = pnVar10->border;
      auVar15 = CONCAT412(0.0 - fVar1,
                          CONCAT48(0.0 - fVar1,
                                   CONCAT44(local_208.bounds.y - fVar1,local_208.bounds.x - fVar1)))
      ;
      fVar20 = fVar1 + fVar1;
      fVar17 = fVar17 + fVar20;
      fVar21 = fVar21 + fVar20;
      fVar19 = fVar19 + fVar20;
      fVar20 = fVar20 + 0.0;
      local_208.bounds.w = fVar17;
      local_208.bounds.x = local_208.bounds.x - fVar1;
      local_208.bounds.y = local_208.bounds.y - fVar1;
      local_208.bounds.h = fVar21;
    }
    nVar22 = local_208.bounds;
    if ((local_208.flags & 0x20) == 0) {
      nVar5 = (ctx->style).window.scrollbar_size;
      fVar17 = fVar17 + nVar5.x;
      fVar21 = fVar21 + nVar5.y;
      fVar19 = fVar19 + 0.0;
      fVar20 = fVar20 + 0.0;
      local_208.bounds.h = fVar21;
      local_208.bounds.w = fVar17;
      local_208.bounds._0_8_ = nVar22._0_8_;
    }
    local_208.scrollbar.x = *pnVar10->offset_x;
    local_208.scrollbar.y = *pnVar10->offset_y;
    local_208.buffer.base = (pnVar9->buffer).base;
    local_208.buffer.clip.x = (pnVar9->buffer).clip.x;
    local_208.buffer.clip.y = (pnVar9->buffer).clip.y;
    local_208.buffer.clip.w = (pnVar9->buffer).clip.w;
    local_208.buffer.clip.h = (pnVar9->buffer).clip.h;
    local_208.buffer.use_clipping = (pnVar9->buffer).use_clipping;
    local_208.buffer._28_4_ = *(undefined4 *)&(pnVar9->buffer).field_0x1c;
    local_208.buffer.userdata = (pnVar9->buffer).userdata;
    local_208.buffer.begin = (pnVar9->buffer).begin;
    local_208.buffer.end = (pnVar9->buffer).end;
    local_208.buffer.last = (pnVar9->buffer).last;
    ctx->current = &local_208;
    uVar3 = (pnVar11->clip).x;
    uVar7 = (pnVar11->clip).y;
    auVar13._4_4_ = uVar7;
    auVar13._0_4_ = uVar3;
    uVar4 = (pnVar11->clip).w;
    uVar8 = (pnVar11->clip).h;
    auVar13._8_8_ = 0;
    auVar13 = maxps(auVar15,auVar13);
    auVar14._0_4_ = (float)uVar4 + (float)uVar3;
    auVar14._4_4_ = (float)uVar8 + (float)uVar7;
    auVar14._8_8_ = 0;
    auVar12._4_4_ = auVar15._4_4_ + fVar21 + fVar18;
    auVar12._0_4_ = fVar17 + auVar15._0_4_;
    auVar12._8_4_ = fVar19 + auVar15._8_4_;
    auVar12._12_4_ = fVar20 + auVar15._12_4_;
    auVar15 = minps(auVar14,auVar12);
    auVar16._0_4_ = auVar15._0_4_ - auVar13._0_4_;
    auVar16._4_4_ = auVar15._4_4_ - auVar13._4_4_;
    auVar16._8_4_ = auVar15._8_4_ - auVar13._8_4_;
    auVar16._12_4_ = auVar15._12_4_ - auVar13._12_4_;
    auVar15 = maxps(auVar16,ZEXT816(0));
    nVar22._0_8_ = auVar13._0_8_;
    nVar22._8_8_ = auVar15._0_8_;
    local_208.layout = pnVar10;
    local_208.parent = pnVar9;
    nk_push_scissor(&local_208.buffer,nVar22);
    nk_end(ctx);
    (pnVar9->buffer).end = local_208.buffer.end;
    (pnVar9->buffer).last = local_208.buffer.last;
    (pnVar9->buffer).userdata = local_208.buffer.userdata;
    (pnVar9->buffer).begin = local_208.buffer.begin;
    (pnVar9->buffer).clip.w = local_208.buffer.clip.w;
    (pnVar9->buffer).clip.h = local_208.buffer.clip.h;
    (pnVar9->buffer).use_clipping = local_208.buffer.use_clipping;
    *(undefined4 *)&(pnVar9->buffer).field_0x1c = local_208.buffer._28_4_;
    (pnVar9->buffer).base = local_208.buffer.base;
    (pnVar9->buffer).clip.x = local_208.buffer.clip.x;
    (pnVar9->buffer).clip.y = local_208.buffer.clip.y;
    nk_push_scissor(&pnVar9->buffer,pnVar11->clip);
    ctx->current = pnVar9;
    pnVar9->layout = pnVar11;
    (pnVar10->bounds).x = local_208.bounds.x;
    (pnVar10->bounds).y = local_208.bounds.y;
    (pnVar10->bounds).w = local_208.bounds.w;
    (pnVar10->bounds).h = local_208.bounds.h;
  }
  return;
}

Assistant:

NK_API void
nk_group_scrolled_end(struct nk_context *ctx)
{
struct nk_window *win;
struct nk_panel *parent;
struct nk_panel *g;

struct nk_rect clip;
struct nk_window pan;
struct nk_vec2 panel_padding;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current)
return;

/* make sure nk_group_begin was called correctly */
NK_ASSERT(ctx->current);
win = ctx->current;
NK_ASSERT(win->layout);
g = win->layout;
NK_ASSERT(g->parent);
parent = g->parent;

/* dummy window */
nk_zero_struct(pan);
panel_padding = nk_panel_get_padding(&ctx->style, NK_PANEL_GROUP);
pan.bounds.y = g->bounds.y - (g->header_height + g->menu.h);
pan.bounds.x = g->bounds.x - panel_padding.x;
pan.bounds.w = g->bounds.w + 2 * panel_padding.x;
pan.bounds.h = g->bounds.h + g->header_height + g->menu.h;
if (g->flags & NK_WINDOW_BORDER) {
pan.bounds.x -= g->border;
pan.bounds.y -= g->border;
pan.bounds.w += 2*g->border;
pan.bounds.h += 2*g->border;
}
if (!(g->flags & NK_WINDOW_NO_SCROLLBAR)) {
pan.bounds.w += ctx->style.window.scrollbar_size.x;
pan.bounds.h += ctx->style.window.scrollbar_size.y;
}
pan.scrollbar.x = *g->offset_x;
pan.scrollbar.y = *g->offset_y;
pan.flags = g->flags;
pan.buffer = win->buffer;
pan.layout = g;
pan.parent = win;
ctx->current = &pan;

/* make sure group has correct clipping rectangle */
nk_unify(&clip, &parent->clip, pan.bounds.x, pan.bounds.y,
pan.bounds.x + pan.bounds.w, pan.bounds.y + pan.bounds.h + panel_padding.x);
nk_push_scissor(&pan.buffer, clip);
nk_end(ctx);

win->buffer = pan.buffer;
nk_push_scissor(&win->buffer, parent->clip);
ctx->current = win;
win->layout = parent;
g->bounds = pan.bounds;
return;
}